

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O1

Error __thiscall
miniros::master::ParameterStorage::setParam
          (ParameterStorage *this,string *caller_id,string *key,RpcValue *value)

{
  Level level;
  void *logger_handle;
  int iVar1;
  Error EVar2;
  ostream *poVar3;
  XmlRpcValue *this_00;
  long *plVar4;
  RpcValue *__n;
  long *plVar5;
  void *__buf;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar6;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248 [2];
  long local_238 [2];
  Path name;
  string fullKey;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  __n = value;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(key->_M_dataplus)._M_p,key->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
  XmlRpc::XmlRpcValue::write(value,(int)local_1a8,__buf,(size_t)__n);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," from ",6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(caller_id->_M_dataplus)._M_p,caller_id->_M_string_length);
  names::resolve(&fullKey,caller_id,key,false);
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (setParam::loc.initialized_ == false) {
    local_248[0] = local_238;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"miniros.unknown_package","");
    plVar4 = (long *)::std::__cxx11::string::append((char *)local_248);
    local_268 = &local_258;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_258 = *plVar5;
      lStack_250 = plVar4[3];
    }
    else {
      local_258 = *plVar5;
      local_268 = (long *)*plVar4;
    }
    local_260 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_268);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      name._16_8_ = *plVar5;
      name.m_fullPath._M_dataplus._M_p = (pointer)plVar4[3];
      name.m_lastName._M_len = (size_t)&name.m_absolute;
    }
    else {
      name._16_8_ = *plVar5;
      name.m_lastName._M_len = (size_t)*plVar4;
    }
    name.m_lastName._M_str = (char *)plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    console::initializeLogLocation(&setParam::loc,(string *)&name,Info);
    if ((bool *)name.m_lastName._M_len != &name.m_absolute) {
      operator_delete((void *)name.m_lastName._M_len,name._16_8_ + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
  }
  if (setParam::loc.level_ != Info) {
    console::setLogLocationLevel(&setParam::loc,Info);
    console::checkLogLocationEnabled(&setParam::loc);
  }
  if (setParam::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,setParam::loc.logger_,setParam::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                   ,0x97,
                   "Error miniros::master::ParameterStorage::setParam(const std::string &, const std::string &, const RpcValue &)"
                   ,"setParam(\"%s\") from \"%s\", key=\"%s\"",fullKey._M_dataplus._M_p,
                   (caller_id->_M_dataplus)._M_p,(key->_M_dataplus)._M_p);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_parameterLock);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  iVar1 = ::std::__cxx11::string::compare((char *)&fullKey);
  if (iVar1 == 0) {
    if (value->_type != TypeStruct) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
          ::loc.initialized_ == false) {
        local_248[0] = local_238;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"miniros.unknown_package","");
        plVar4 = (long *)::std::__cxx11::string::append((char *)local_248);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_258 = *plVar5;
          lStack_250 = plVar4[3];
          local_268 = &local_258;
        }
        else {
          local_258 = *plVar5;
          local_268 = (long *)*plVar4;
        }
        local_260 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_268);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          name._16_8_ = *plVar5;
          name.m_fullPath._M_dataplus._M_p = (pointer)plVar4[3];
          name.m_lastName._M_len = (size_t)&name.m_absolute;
        }
        else {
          name._16_8_ = *plVar5;
          name.m_lastName._M_len = (size_t)*plVar4;
        }
        name.m_lastName._M_str = (char *)plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        console::initializeLogLocation
                  (&setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                    ::loc,(string *)&name,Error);
        if ((bool *)name.m_lastName._M_len != &name.m_absolute) {
          operator_delete((void *)name.m_lastName._M_len,name._16_8_ + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,local_258 + 1);
        }
        if (local_248[0] != local_238) {
          operator_delete(local_248[0],local_238[0] + 1);
        }
      }
      if (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
          ::loc.level_ != Error) {
        console::setLogLocationLevel
                  (&setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                    ::loc,Error);
        console::checkLogLocationEnabled
                  (&setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                    ::loc);
      }
      logger_handle =
           setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
           ::loc.logger_;
      level = setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
              ::loc.level_;
      EVar2.code = InvalidValue;
      if (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
          ::loc.logger_enabled_ == true) {
        ::std::__cxx11::stringbuf::str();
        console::print((FilterBase *)0x0,logger_handle,level,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                       ,0x9f,
                       "Error miniros::master::ParameterStorage::setParam(const std::string &, const std::string &, const RpcValue &)"
                       ,"setParam(\"%s\") - cannot set root of parameter tree to non-dictionary",
                       name.m_lastName._M_len);
        if ((bool *)name.m_lastName._M_len != &name.m_absolute) {
          operator_delete((void *)name.m_lastName._M_len,name._16_8_ + 1);
        }
      }
      goto LAB_0024271c;
    }
    XmlRpc::XmlRpcValue::operator=(&this->m_parameterRoot,value);
    checkParamUpdates(this,&fullKey,&this->m_parameterRoot);
  }
  else {
    names::Path::Path(&name);
    EVar2 = names::Path::fromString(&name,&fullKey);
    if (EVar2.code != Ok) {
      names::Path::~Path(&name);
      goto LAB_0024271c;
    }
    pVar6 = findParameter(this,&name,true);
    this_00 = pVar6.first;
    if (this_00 == (XmlRpcValue *)0x0) {
      EVar2.code = ParameterNotFound;
    }
    else {
      XmlRpc::XmlRpcValue::operator=(this_00,value);
      checkParamUpdates(this,&fullKey,this_00);
    }
    names::Path::~Path(&name);
    if (this_00 == (XmlRpcValue *)0x0) goto LAB_0024271c;
  }
  EVar2.code = Ok;
LAB_0024271c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fullKey._M_dataplus._M_p != &fullKey.field_2) {
    operator_delete(fullKey._M_dataplus._M_p,fullKey.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  ::std::ios_base::~ios_base(local_138);
  return (Error)EVar2.code;
}

Assistant:

Error ParameterStorage::setParam(const std::string& caller_id, const std::string& key, const RpcValue& value)
{
  std::stringstream ss;
  ss << key << "=";
  value.write(ss);
  ss << " from " << caller_id;

  std::string fullKey = miniros::names::resolve(caller_id, key, false);
  MINIROS_INFO_NAMED("rosparam", "setParam(\"%s\") from \"%s\", key=\"%s\"", fullKey.c_str(), caller_id.c_str(), key.c_str());
  std::scoped_lock<std::mutex> m_lock(m_parameterLock);

  if (fullKey == "/") {
    if (value.getType() == RpcValue::TypeStruct) {
      m_parameterRoot = value;
      checkParamUpdates(fullKey, &m_parameterRoot);
    } else {
      MINIROS_ERROR_NAMED("rosparam", "setParam(\"%s\") - cannot set root of parameter tree to non-dictionary", ss.str().c_str());
      return Error::InvalidValue;
    }
  } else {
    names::Path name;
    if (auto err = name.fromString(fullKey); !err)
      return err;
    RpcValue* param = findParameter(name, true).first;
    if (!param)
      return Error::ParameterNotFound;
    *param = value;
    checkParamUpdates(fullKey, param);
  }

  return Error::Ok;
}